

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::MILSpec::Value_BlobFileValue::_InternalParse
          (Value_BlobFileValue *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  internal *this_01;
  size_t size;
  bool bVar2;
  string *s;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  undefined8 *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *p;
  pair<const_char_*,_unsigned_int> pVar7;
  pair<const_char_*,_unsigned_long> pVar8;
  StringPiece str;
  byte *local_38;
  char *field_name;
  
  local_38 = (byte *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  if (!bVar2) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *local_38;
      uVar5 = (uint)bVar1;
      p = local_38 + 1;
      if ((char)bVar1 < '\0') {
        uVar5 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar7 = google::protobuf::internal::ReadTagFallback((char *)local_38,uVar5);
          p = (byte *)pVar7.first;
          uVar5 = pVar7.second;
        }
        else {
          p = local_38 + 2;
        }
      }
      uVar3 = uVar5 >> 3;
      field_name = (char *)(ulong)uVar3;
      local_38 = p;
      if (uVar3 == 2) {
        if ((char)uVar5 != '\x10') {
LAB_0020bedd:
          if ((uVar5 == 0) || ((uVar5 & 7) == 4)) {
            if (p == (byte *)0x0) {
              return (char *)0x0;
            }
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar5 - 1;
            return (char *)p;
          }
          if ((this_00->ptr_ & 1U) == 0) {
            unknown = google::protobuf::internal::InternalMetadata::
                      mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
          }
          else {
            unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((this_00->ptr_ & 0xfffffffffffffffcU) + 8);
          }
          local_38 = (byte *)google::protobuf::internal::UnknownFieldParse
                                       (uVar5,unknown,(char *)local_38,ctx);
          goto joined_r0x0020be9c;
        }
        uVar4 = (ulong)(char)*p;
        local_38 = p + 1;
        if ((long)uVar4 < 0) {
          uVar5 = ((uint)*local_38 * 0x80 + (uint)*p) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar8 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar5);
            local_38 = (byte *)pVar8.first;
            this->offset_ = pVar8.second;
            goto joined_r0x0020be9c;
          }
          uVar4 = (ulong)uVar5;
          local_38 = p + 2;
        }
        this->offset_ = uVar4;
      }
      else {
        if ((uVar3 != 1) || ((char)uVar5 != '\n')) goto LAB_0020bedd;
        puVar6 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
        if ((this_00->ptr_ & 1U) != 0) {
          puVar6 = (undefined8 *)*puVar6;
        }
        s = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(&this->filename_,puVar6);
        local_38 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                     (s,(char *)local_38,ctx);
        this_01 = (internal *)(s->_M_dataplus)._M_p;
        size = s->_M_string_length;
        if ((long)size < 0) {
          google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (size,"string length exceeds max size");
        }
        str.length_ = 0;
        str.ptr_ = (char *)size;
        bVar2 = google::protobuf::internal::VerifyUTF8(this_01,str,field_name);
        if (!bVar2) {
          return (char *)0x0;
        }
joined_r0x0020be9c:
        if (local_38 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_38;
}

Assistant:

const char* Value_BlobFileValue::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // string fileName = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          auto str = _internal_mutable_filename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // uint64 offset = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          offset_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}